

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescale_freqs.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var1;
  long *plVar2;
  pointer pcVar3;
  undefined8 uVar4;
  bool bVar5;
  basic_regex_implementation<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
  *__tmp;
  any *operand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  const_iterator cVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  string short_name;
  directory_iterator i;
  string file_name;
  smatch what;
  directory_iterator end_itr;
  path p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input_dir;
  variables_map cmdargs;
  key_type local_278;
  directory_iterator local_250;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  shared_count sStack_240;
  undefined1 local_238 [56];
  shared_count sStack_200;
  undefined1 local_1f8 [32];
  uchar uStack_1d8;
  undefined8 uStack_1d7;
  undefined8 uStack_1cf;
  shared_ptr<boost::re_detail_107400::named_subexpressions> local_1c0;
  int local_1b0;
  bool local_1ac;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_1a0;
  error_code local_198;
  undefined1 local_188 [16];
  name *local_178;
  element_type *local_170;
  name local_168 [2];
  string local_158;
  long *local_138;
  long local_130;
  long local_128 [2];
  string local_118;
  string local_f8;
  undefined1 local_d8 [8];
  code *local_d0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [8];
  _Rb_tree_node_base local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  parse_cmdargs((int)local_d0,(char **)(ulong)(uint)argc);
  plVar2 = (long *)(local_1f8 + 0x10);
  local_1f8._0_8_ = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"input","");
  operand = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_d0);
  pbVar6 = boost::any_cast<std::__cxx11::string_const&>(operand);
  local_178 = local_168;
  pcVar3 = (pbVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,pcVar3,pcVar3 + pbVar6->_M_string_length);
  if ((long *)local_1f8._0_8_ != plVar2) {
    operator_delete((void *)local_1f8._0_8_,CONCAT71(local_1f8._17_7_,local_1f8[0x10]) + 1);
  }
  boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::basic_regex
            ((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
             ((long)local_238 + 0x30),".*\\.u32",0);
  local_1f8._0_8_ = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"text","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_c0,(key_type *)local_1f8);
  if ((long *)local_1f8._0_8_ != plVar2) {
    operator_delete((void *)local_1f8._0_8_,CONCAT71(local_1f8._17_7_,local_1f8[0x10]) + 1);
  }
  if (cVar7._M_node != &local_b8) {
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    basic_regex((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
                &local_198,".*\\.txt",0);
    local_1f8._8_8_ = sStack_200.pi_;
    local_1f8._0_8_ = local_238._48_8_;
    if ((sp_counted_base *)local_198.cat_ != (sp_counted_base *)0x0) {
      LOCK();
      *(uint *)&(local_198.cat_)->id_ = *(uint *)&(local_198.cat_)->id_ + 1;
      UNLOCK();
    }
    local_238._48_4_ = local_198.val_;
    local_238[0x34] = local_198.failed_;
    local_238._53_3_ = local_198._5_3_;
    sStack_200.pi_ = (sp_counted_base *)local_198.cat_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_1f8 + 8));
    boost::detail::shared_count::~shared_count((shared_count *)&local_198.cat_);
  }
  local_198._0_8_ = local_188;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,local_178,(long)&local_178->index + (long)local_170);
  boost::filesystem::detail::status((path *)local_1f8,&local_198);
  if (local_1f8._0_4_ == 2) {
    boost::filesystem::path::filename();
    boost::basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>> *)
               &local_278,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,0);
    sStack_240.pi_ = sStack_200.pi_;
    local_248._M_current = (char *)local_238._48_8_;
    if ((pointer)local_278._M_string_length != (pointer)0x0) {
      LOCK();
      p_Var1 = &((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_278._M_string_length)->second;
      *(uint_least32_t *)&p_Var1->_M_current = *(uint_least32_t *)&p_Var1->_M_current + 1;
      UNLOCK();
    }
    local_238._48_8_ = local_278._M_dataplus._M_p;
    sStack_200.pi_ = (sp_counted_base *)local_278._M_string_length;
    boost::detail::shared_count::~shared_count(&sStack_240);
    boost::detail::shared_count::~shared_count((shared_count *)((long)&local_278 + 8));
    if ((long *)local_1f8._0_8_ != plVar2) {
      operator_delete((void *)local_1f8._0_8_,CONCAT71(local_1f8._17_7_,local_1f8[0x10]) + 1);
    }
    boost::filesystem::path::parent_path();
    std::__cxx11::string::_M_assign((string *)&local_178);
    if ((long *)local_1f8._0_8_ != plVar2) {
      operator_delete((void *)local_1f8._0_8_,CONCAT71(local_1f8._17_7_,local_1f8[0x10]) + 1);
    }
  }
  local_1a0.px = (dir_itr_imp *)0x0;
  local_1f8._0_8_ = plVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,local_178,(long)&local_178->index + (long)local_170);
  boost::filesystem::directory_iterator::directory_iterator(&local_250,(path *)local_1f8,none);
  if ((long *)local_1f8._0_8_ != plVar2) {
    operator_delete((void *)local_1f8._0_8_,CONCAT71(local_1f8._17_7_,local_1f8[0x10]) + 1);
  }
  do {
    if ((local_250.m_imp.px == (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_1a0.px)
       || (((local_250.m_imp.px == (dir_itr_imp *)0x0 ||
            (*(long *)((long)local_250.m_imp.px + 0x38) == 0)) &&
           ((local_1a0.px == (dir_itr_imp *)0x0 || (*(long *)(local_1a0.px + 0x38) == 0)))))) {
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_250.m_imp)
      ;
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_1a0);
      if ((element_type *)local_198._0_8_ != (element_type *)local_188) {
        operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
      }
      boost::detail::shared_count::~shared_count(&sStack_200);
      if (local_178 != local_168) {
        operator_delete(local_178,(long)local_168[0] + 1);
      }
      local_d0[0] = std::logic_error::logic_error;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(local_90);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
      ::~_Rb_tree(local_c0);
      return 0;
    }
    boost::filesystem::directory_entry::get_status((error_code *)local_d8);
    if (local_d8._0_4_ == 2) {
      uStack_1d8 = '\0';
      uStack_1d7 = 0;
      uStack_1cf = 0;
      local_1f8._0_8_ = (long *)0x0;
      local_1f8._8_8_ = (pointer)0x0;
      local_1f8[0x10] = '\0';
      local_1f8._17_7_ = 0;
      local_1f8[0x18] = '\0';
      local_1f8._25_7_ = 0;
      local_1c0 = (shared_ptr<boost::re_detail_107400::named_subexpressions>)(ZEXT416(0) << 0x40);
      local_1b0 = 0;
      local_1ac = true;
      boost::filesystem::path::filename();
      bVar5 = boost::
              regex_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                        (local_248,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(local_248._M_current + (long)&(sStack_240.pi_)->_vptr_sp_counted_base),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_1f8,
                         (basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                          *)((long)local_238 + 0x30),format_default);
      if ((element_type *)local_248._M_current != (element_type *)local_238) {
        operator_delete(local_248._M_current,(ulong)(local_238._0_8_ + 1));
      }
      if (bVar5) {
        local_248._M_current = local_238;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_248,*(long *)((long)local_250.m_imp.px + 8),
                   *(long *)((long)local_250.m_imp.px + 0x10) +
                   *(long *)((long)local_250.m_imp.px + 8));
        local_238._16_8_ = (pointer)0x0;
        local_238._24_8_ = (element_type *)0x0;
        local_238._32_8_ = (sp_counted_base *)0x0;
        local_278._M_dataplus._M_p = (pointer)((long)&local_278 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"text","");
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::find(local_c0,&local_278);
        if (local_278._M_dataplus._M_p != (pointer)((long)&local_278 + 0x10)) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if (cVar7._M_node == &local_b8) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,local_248._M_current,
                     (long)&(sStack_240.pi_ + -6)[6]._vptr_sp_counted_base +
                     (long)local_248._M_current);
          read_file_u32((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_278,&local_118
                       );
          uVar4 = local_238._32_8_;
          uVar8 = local_238._16_8_;
          local_238._32_8_ = local_278.field_2._M_allocated_capacity;
          local_238._16_8_ = local_278._M_dataplus._M_p;
          local_238._24_8_ = local_278._M_string_length;
          local_278._0_16_ = ZEXT816(0) << 0x20;
          local_278.field_2._M_allocated_capacity = 0;
          if ((pointer)uVar8 != (pointer)0x0) {
            operator_delete((void *)uVar8,uVar4 - uVar8);
          }
          if (local_278._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_278._M_dataplus._M_p,
                            local_278.field_2._M_allocated_capacity -
                            (long)local_278._M_dataplus._M_p);
          }
          uVar8 = local_118.field_2._M_allocated_capacity;
          _Var9._M_p = local_118._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) goto LAB_00124c4c;
        }
        else {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,local_248._M_current,
                     (long)&(sStack_240.pi_ + -6)[6]._vptr_sp_counted_base +
                     (long)local_248._M_current);
          read_file_text((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_278,&local_f8
                        );
          uVar4 = local_238._32_8_;
          uVar8 = local_238._16_8_;
          local_238._32_8_ = local_278.field_2._M_allocated_capacity;
          local_238._16_8_ = local_278._M_dataplus._M_p;
          local_238._24_8_ = local_278._M_string_length;
          local_278._0_16_ = ZEXT816(0) << 0x20;
          local_278.field_2._M_allocated_capacity = 0;
          if ((pointer)uVar8 != (pointer)0x0) {
            operator_delete((void *)uVar8,uVar4 - uVar8);
          }
          if (local_278._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_278._M_dataplus._M_p,
                            local_278.field_2._M_allocated_capacity -
                            (long)local_278._M_dataplus._M_p);
          }
          uVar8 = local_f8.field_2._M_allocated_capacity;
          _Var9._M_p = local_f8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_00124c4c:
            operator_delete(_Var9._M_p,uVar8 + 1);
          }
        }
        boost::filesystem::path::stem();
        local_278._M_dataplus._M_p = (pointer)((long)&local_278 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,local_138,local_130 + (long)local_138);
        if (local_138 != local_128) {
          operator_delete(local_138,local_128[0] + 1);
        }
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,local_278._M_dataplus._M_p,
                   local_278._M_dataplus._M_p + local_278._M_string_length);
        rescale_freqs((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      ((long)local_238 + 0x10),&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if (local_278._M_dataplus._M_p != (pointer)((long)&local_278 + 0x10)) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_238._16_8_ != (pointer)0x0) {
          operator_delete((void *)local_238._16_8_,local_238._32_8_ - local_238._16_8_);
        }
        if ((element_type *)local_248._M_current != (element_type *)local_238) {
          operator_delete(local_248._M_current,(ulong)(local_238._0_8_ + 1));
        }
      }
      boost::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_1f8);
    }
    boost::filesystem::detail::directory_iterator_increment(&local_250,(error_code *)0x0);
  } while( true );
}

Assistant:

int main(int argc, char const* argv[])
{
    auto cmdargs = parse_cmdargs(argc, argv);
    auto input_dir = cmdargs["input"].as<std::string>();

    boost::regex input_file_filter(".*\\.u32");
    if (cmdargs.count("text")) {
        input_file_filter = boost::regex(".*\\.txt");
    }

    // single file also works!
    boost::filesystem::path p(input_dir);
    if (boost::filesystem::is_regular_file(p)) {
        input_file_filter = boost::regex(p.filename().string());
        input_dir = p.parent_path().string();
    }

    boost::filesystem::directory_iterator
        end_itr; // Default ctor yields past-the-end
    for (boost::filesystem::directory_iterator i(input_dir); i != end_itr;
         ++i) {
        if (!boost::filesystem::is_regular_file(i->status()))
            continue;
        boost::smatch what;
        if (!boost::regex_match(
                i->path().filename().string(), what, input_file_filter))
            continue;

        std::string file_name = i->path().string();
        std::vector<uint32_t> input_u32s;
        if (cmdargs.count("text")) {
            input_u32s = read_file_text(file_name);
        } else {
            input_u32s = read_file_u32(file_name);
        }
        std::string short_name = i->path().stem().string();

        rescale_freqs(input_u32s, short_name);
    }

    return EXIT_SUCCESS;
}